

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxDevexPR<double>::buildBestPriceVectorEnterCoDim
          (SPxDevexPR<double> *this,double *best,double feastol)

{
  double viol;
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  char *pcVar4;
  int *piVar5;
  IdxElement *pIVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  int i_1;
  int i;
  IdxElement price;
  double *pen;
  double *test;
  double x;
  int nsorted;
  int idx;
  int in_stack_000000a0;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff74;
  long in_stack_ffffffffffffff80;
  int i_00;
  SPxSolverBase<double> *in_stack_ffffffffffffff88;
  int local_58;
  uint local_54;
  DataKey local_8;
  
  SPxSolverBase<double>::test(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e3d2b);
  pdVar3 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e3d48);
  Array<soplex::SPxPricer<double>::IdxElement>::clear
            ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e3d5b);
  IdxSet::clear((IdxSet *)(in_RDI + 0x90));
  local_54 = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x808));
  uVar7 = extraout_RDX;
  while (local_54 = local_54 - 1, -1 < (int)local_54) {
    pcVar4 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x808),(char *)(ulong)local_54,
                           (int)uVar7);
    iVar1 = (int)pcVar4;
    viol = pdVar2[iVar1];
    if (-in_XMM0_Qa <= viol) {
      IdxSet::remove((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x808),(char *)(ulong)local_54);
      piVar5 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x880),iVar1);
      *piVar5 = 0;
      uVar7 = extraout_RDX_01;
    }
    else {
      piVar5 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x880),iVar1);
      *piVar5 = 1;
      devexpr::computePrice<double>(viol,pdVar3[iVar1],in_XMM0_Qa);
      Array<soplex::SPxPricer<double>::IdxElement>::append
                ((Array<soplex::SPxPricer<double>::IdxElement> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (IdxElement *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      uVar7 = extraout_RDX_00;
    }
  }
  pIVar6 = Array<soplex::SPxPricer<double>::IdxElement>::get_const_ptr
                     ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e3ea8);
  *(IdxElement **)(in_RDI + 0x30) = pIVar6;
  Array<soplex::SPxPricer<double>::IdxElement>::get_ptr
            ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e3eba);
  Array<soplex::SPxPricer<double>::IdxElement>::size
            ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e3ed9);
  uVar8 = 1;
  iVar1 = SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                    ((IdxElement *)this,(IdxCompare *)best,feastol._4_4_,feastol._0_4_,idx,nsorted,
                     in_stack_000000a0,x._7_1_);
  for (local_58 = 0; i_00 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20), local_58 < iVar1;
      local_58 = local_58 + 1) {
    in_stack_ffffffffffffff80 = in_RDI + 0x90;
    Array<soplex::SPxPricer<double>::IdxElement>::operator[]
              ((Array<soplex::SPxPricer<double>::IdxElement> *)
               CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    DIdxSet::addIdx((DIdxSet *)CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffff88 = (SPxSolverBase<double> *)(*(long *)(in_RDI + 0x10) + 0x880);
    pIVar6 = Array<soplex::SPxPricer<double>::IdxElement>::operator[]
                       ((Array<soplex::SPxPricer<double>::IdxElement> *)
                        CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    piVar5 = DataArray<int>::operator[]((DataArray<int> *)in_stack_ffffffffffffff88,pIVar6->idx);
    *piVar5 = 2;
  }
  if (iVar1 < 1) {
    SPxId::SPxId((SPxId *)0x2e3feb);
  }
  else {
    pIVar6 = Array<soplex::SPxPricer<double>::IdxElement>::operator[]
                       ((Array<soplex::SPxPricer<double>::IdxElement> *)
                        CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    *in_RSI = pIVar6->val;
    Array<soplex::SPxPricer<double>::IdxElement>::operator[]
              ((Array<soplex::SPxPricer<double>::IdxElement> *)
               CONCAT44(in_stack_ffffffffffffff74,uVar8),in_stack_ffffffffffffff6c);
    local_8 = (DataKey)SPxSolverBase<double>::id(in_stack_ffffffffffffff88,i_00);
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxDevexPR<R>::buildBestPriceVectorEnterCoDim(R& best, R feastol)
{
   int idx;
   int nsorted;
   R x;
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   pricesCo.clear();
   bestPricesCo.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         this->thesolver->isInfeasibleCo[idx] = this->VIOLATED;
         price.idx = idx;
         price.val = devexpr::computePrice(x, pen[idx], feastol);
         pricesCo.append(price);
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < pricesCo.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(pricesCo[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(pricesCo[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = pricesCo.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(pricesCo.get_ptr(), this->compare, 0, pricesCo.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPricesCo.addIdx(pricesCo[i].idx);
      this->thesolver->isInfeasibleCo[pricesCo[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = pricesCo[0].val;
      return this->thesolver->id(pricesCo[0].idx);
   }
   else
      return SPxId();
}